

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O0

void __thiscall
fizplex::LPTestFeasibility_IsFeasibleForFreeVarAndRangeRow_Test::TestBody
          (LPTestFeasibility_IsFeasibleForFreeVarAndRangeRow_Test *this)

{
  initializer_list<double> l;
  initializer_list<double> l_00;
  initializer_list<double> l_01;
  initializer_list<double> l_02;
  initializer_list<double> l_03;
  initializer_list<fizplex::DVector> __l;
  initializer_list<fizplex::DVector> __l_00;
  LPTestFeasibility *in_RDI;
  double in_stack_fffffffffffffdb8;
  double in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  ColType in_stack_fffffffffffffdcc;
  LP *in_stack_fffffffffffffdd0;
  iterator in_stack_fffffffffffffdd8;
  LP *in_stack_fffffffffffffde0;
  allocator_type *in_stack_fffffffffffffde8;
  LP *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  RowType in_stack_fffffffffffffdfc;
  LP *in_stack_fffffffffffffe00;
  undefined1 **local_1e0;
  vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> *in_stack_fffffffffffffe40;
  DVector *vecs;
  undefined1 *puVar1;
  undefined1 feasible;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 *local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 *local_168;
  undefined8 local_160;
  undefined8 *local_158;
  undefined1 *local_150 [3];
  undefined1 local_138 [24];
  undefined8 *local_120;
  undefined8 local_118;
  undefined1 local_f1;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 *local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 *local_c0;
  undefined8 local_b8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 *local_90;
  undefined8 local_88;
  DVector *local_80;
  DVector local_78;
  undefined1 local_60 [24];
  undefined1 local_48 [24];
  DVector local_30 [2];
  
  LP::add_column(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdb8,9.21788156758931e-318);
  LP::add_row(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,(double)in_stack_fffffffffffffdf0,
              (double)in_stack_fffffffffffffde8);
  LP::add_value(in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8,
                (size_t)in_stack_fffffffffffffdd0,
                (double)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  LP::add_logicals(in_stack_fffffffffffffdf0);
  local_80 = &local_78;
  local_a0 = 0;
  local_98 = 0x4014000000000000;
  local_90 = &local_a0;
  local_88 = 2;
  l._M_len = (size_type)in_stack_fffffffffffffde0;
  l._M_array = in_stack_fffffffffffffdd8;
  DVector::DVector((DVector *)in_stack_fffffffffffffdd0,l);
  local_80 = (DVector *)local_60;
  local_d0 = 0xc014000000000000;
  local_c8 = 0x4024000000000000;
  local_c0 = &local_d0;
  local_b8 = 2;
  l_00._M_len = (size_type)in_stack_fffffffffffffde0;
  l_00._M_array = in_stack_fffffffffffffdd8;
  DVector::DVector((DVector *)in_stack_fffffffffffffdd0,l_00);
  local_80 = (DVector *)local_48;
  local_f0 = 0x4014000000000000;
  local_e8 = 0;
  local_e0 = &local_f0;
  local_d8 = 2;
  l_01._M_len = (size_type)in_stack_fffffffffffffde0;
  l_01._M_array = in_stack_fffffffffffffdd8;
  DVector::DVector((DVector *)in_stack_fffffffffffffdd0,l_01);
  local_30[0].vals._M_size = (size_t)&local_78;
  local_30[0].vals._M_data = (double *)0x3;
  puVar1 = &local_f1;
  std::allocator<fizplex::DVector>::allocator((allocator<fizplex::DVector> *)0x1c799d);
  __l._M_array._4_4_ = in_stack_fffffffffffffdfc;
  __l._M_array._0_4_ = in_stack_fffffffffffffdf8;
  __l._M_len = (size_type)in_stack_fffffffffffffe00;
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::vector
            ((vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> *)
             in_stack_fffffffffffffdf0,__l,in_stack_fffffffffffffde8);
  LPTestFeasibility::check_feasible(in_RDI,SUB81((ulong)puVar1 >> 0x38,0),in_stack_fffffffffffffe40)
  ;
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::~vector
            ((vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> *)
             in_stack_fffffffffffffdd0);
  std::allocator<fizplex::DVector>::~allocator((allocator<fizplex::DVector> *)0x1c79fa);
  vecs = local_30;
  do {
    vecs = vecs + -1;
    DVector::~DVector((DVector *)0x1c7a2c);
    feasible = (undefined1)((ulong)puVar1 >> 0x38);
  } while (vecs != &local_78);
  local_158 = local_150;
  local_178 = 0xc018000000000000;
  local_170 = 0x3ff0000000000000;
  local_168 = &local_178;
  local_160 = 2;
  l_02._M_len = (size_type)in_stack_fffffffffffffde0;
  l_02._M_array = in_stack_fffffffffffffdd8;
  DVector::DVector((DVector *)in_stack_fffffffffffffdd0,l_02);
  local_158 = (undefined8 *)local_138;
  local_198 = 0x4018000000000000;
  local_190 = 0xbff0000000000000;
  local_188 = &local_198;
  local_180 = 2;
  l_03._M_len = (size_type)in_stack_fffffffffffffde0;
  l_03._M_array = in_stack_fffffffffffffdd8;
  DVector::DVector((DVector *)in_stack_fffffffffffffdd0,l_03);
  local_120 = local_150;
  local_118 = 2;
  std::allocator<fizplex::DVector>::allocator((allocator<fizplex::DVector> *)0x1c7b42);
  __l_00._M_array._4_4_ = in_stack_fffffffffffffdfc;
  __l_00._M_array._0_4_ = in_stack_fffffffffffffdf8;
  __l_00._M_len = (size_type)in_stack_fffffffffffffe00;
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::vector
            ((vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> *)
             in_stack_fffffffffffffdf0,__l_00,in_stack_fffffffffffffde8);
  LPTestFeasibility::check_feasible
            (in_RDI,(bool)feasible,
             (vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> *)vecs);
  std::vector<fizplex::DVector,_std::allocator<fizplex::DVector>_>::~vector
            ((vector<fizplex::DVector,_std::allocator<fizplex::DVector>_> *)
             in_stack_fffffffffffffdd0);
  std::allocator<fizplex::DVector>::~allocator((allocator<fizplex::DVector> *)0x1c7b99);
  local_1e0 = (undefined1 **)&local_120;
  do {
    local_1e0 = local_1e0 + -3;
    DVector::~DVector((DVector *)0x1c7bc2);
  } while (local_1e0 != local_150);
  return;
}

Assistant:

TEST_F(LPTestFeasibility, IsFeasibleForFreeVarAndRangeRow) {
  lp.add_column(ColType::Free, -inf, inf);
  lp.add_row(RowType::Range, -5, 5);
  lp.add_value(0, 0, 1.0);
  lp.add_logicals();

  check_feasible(true, {{0, 5}, {-5, 10}, {5, 0}});
  check_feasible(false, {{-6, 1}, {6, -1}});
}